

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biattentional.cc
# Opt level: O0

void __thiscall
BidirAttentionalModel<dynet::LSTMBuilder>::initialise
          (BidirAttentionalModel<dynet::LSTMBuilder> *this,string *src_file,string *tgt_file,
          Model *model)

{
  void *pvVar1;
  void *pvVar2;
  bool bVar3;
  ostream *poVar4;
  size_type sVar5;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *this_00
  ;
  size_type sVar6;
  ulong uVar7;
  const_reference ppLVar8;
  reference pvVar9;
  reference ppPVar10;
  const_reference ppPVar11;
  Model *in_RCX;
  string *in_RDX;
  uint uVar12;
  uint uVar13;
  string *in_RSI;
  uint uVar14;
  ParameterStorage **p_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *__range2_3;
  ParameterStorage **p_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *__range2_2;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *dparams;
  uint did;
  uint i_1;
  LookupParameterStorage **p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *__range2_1;
  uint i;
  LookupParameterStorage **p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *__range2;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *lparams
  ;
  uint lid;
  text_iarchive ia_1;
  ifstream in_1;
  text_iarchive ia;
  ifstream in;
  AttentionalModel<dynet::LSTMBuilder> tmb;
  AttentionalModel<dynet::LSTMBuilder> smb;
  Model tm;
  Model sm;
  uint uVar15;
  undefined4 in_stack_ffffffffffffee2c;
  undefined4 in_stack_ffffffffffffee34;
  uint in_stack_ffffffffffffee44;
  undefined4 in_stack_ffffffffffffee4c;
  undefined4 in_stack_ffffffffffffee54;
  __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
  local_1090;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *local_1088;
  reference local_1080;
  ParameterStorage **local_1078;
  __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
  local_1070;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *local_1068;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *local_1060;
  uint local_1058;
  uint local_1054;
  reference local_1050;
  LookupParameterStorage **local_1048;
  __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
  local_1040;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *local_1038;
  uint local_102c;
  reference local_1028;
  LookupParameterStorage **local_1020;
  __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
  local_1018;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *local_1010;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
  *local_1008;
  uint local_ffc;
  undefined1 local_f78 [648];
  undefined1 local_cf0 [1282];
  undefined1 in_stack_fffffffffffff812;
  undefined1 in_stack_fffffffffffff813;
  undefined1 in_stack_fffffffffffff814;
  undefined1 in_stack_fffffffffffff815;
  undefined1 in_stack_fffffffffffff816;
  undefined1 in_stack_fffffffffffff817;
  uint in_stack_fffffffffffff818;
  uint in_stack_fffffffffffff81c;
  uint in_stack_fffffffffffff820;
  uint in_stack_fffffffffffff824;
  Model *in_stack_fffffffffffff828;
  AttentionalModel<dynet::LSTMBuilder> *in_stack_fffffffffffff830;
  uint in_stack_fffffffffffff860;
  Model local_148 [136];
  Model local_c0 [136];
  Model *local_38;
  string *local_30;
  string *local_28;
  
  local_38 = in_RCX;
  local_30 = in_RDX;
  local_28 = in_RSI;
  dynet::Model::Model(local_c0);
  dynet::Model::Model(local_148);
  dynet::AttentionalModel<dynet::LSTMBuilder>::AttentionalModel
            (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff824,
             in_stack_fffffffffffff820,in_stack_fffffffffffff81c,in_stack_fffffffffffff818,
             in_stack_fffffffffffff860,(bool)in_stack_fffffffffffff817,
             (bool)in_stack_fffffffffffff816,(bool)in_stack_fffffffffffff815,
             (bool)in_stack_fffffffffffff814,(bool)in_stack_fffffffffffff813,
             (bool)in_stack_fffffffffffff812);
  uVar13 = DOC & 1;
  uVar12 = GIZA_F & 1;
  uVar14 = BIDIR & 1;
  uVar15 = ALIGN_DIM;
  dynet::AttentionalModel<dynet::LSTMBuilder>::AttentionalModel
            (in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff824,
             in_stack_fffffffffffff820,in_stack_fffffffffffff81c,in_stack_fffffffffffff818,
             in_stack_fffffffffffff860,(bool)in_stack_fffffffffffff817,
             (bool)in_stack_fffffffffffff816,(bool)in_stack_fffffffffffff815,
             (bool)in_stack_fffffffffffff814,(bool)in_stack_fffffffffffff813,
             (bool)in_stack_fffffffffffff812);
  poVar4 = std::operator<<((ostream *)&std::cerr,"... loading ");
  poVar4 = std::operator<<(poVar4,local_28);
  poVar4 = std::operator<<(poVar4," ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_cf0,local_28,8);
  boost::archive::text_iarchive::text_iarchive
            ((text_iarchive *)CONCAT44(in_stack_ffffffffffffee54,uVar13),
             (istream *)CONCAT44(in_stack_ffffffffffffee4c,uVar12),in_stack_ffffffffffffee44);
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
            ((interface_iarchive<boost::archive::text_iarchive> *)
             CONCAT44(in_stack_ffffffffffffee34,uVar14),
             (Model *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
  boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x14ffca);
  std::ifstream::~ifstream(local_cf0);
  poVar4 = std::operator<<((ostream *)&std::cerr,"... loading ");
  poVar4 = std::operator<<(poVar4,local_30);
  poVar4 = std::operator<<(poVar4," ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  std::ifstream::ifstream(local_f78,local_30,8);
  boost::archive::text_iarchive::text_iarchive
            ((text_iarchive *)CONCAT44(in_stack_ffffffffffffee54,uVar13),
             (istream *)CONCAT44(in_stack_ffffffffffffee4c,uVar12),in_stack_ffffffffffffee44);
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator>>
            ((interface_iarchive<boost::archive::text_iarchive> *)
             CONCAT44(in_stack_ffffffffffffee34,uVar14),
             (Model *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
  boost::archive::text_iarchive::~text_iarchive((text_iarchive *)0x1500a0);
  std::ifstream::~ifstream(local_f78);
  poVar4 = std::operator<<((ostream *)&std::cerr,"... merging parameters ...");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_ffc = 0;
  local_1008 = dynet::Model::lookup_parameters_list(local_38);
  sVar5 = std::
          vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
          ::size(local_1008);
  this_00 = dynet::Model::lookup_parameters_list(local_c0);
  sVar6 = std::
          vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
          ::size(this_00);
  if (sVar5 != sVar6 * 2) {
    __assert_fail("lparams.size() == 2*sm.lookup_parameters_list().size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                  ,0x6b,
                  "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
                 );
  }
  local_1010 = dynet::Model::lookup_parameters_list(local_c0);
  local_1018._M_current =
       (LookupParameterStorage **)
       std::
       vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>::
       begin((vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
              *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
  local_1020 = (LookupParameterStorage **)
               std::
               vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
               ::end((vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                      *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffee34,uVar14),
                       (__normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
    if (!bVar3) break;
    local_1028 = __gnu_cxx::
                 __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                 ::operator*(&local_1018);
    local_102c = 0;
    while( true ) {
      uVar7 = (ulong)local_102c;
      sVar5 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::size
                        ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)
                         (*local_1028 + 0x108));
      if (sVar5 <= uVar7) break;
      ppLVar8 = std::
                vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                ::operator[](local_1008,(ulong)local_ffc);
      pvVar9 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                         ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)
                          (*ppLVar8 + 0x108),(ulong)local_102c);
      pvVar1 = *(void **)(pvVar9 + 0x28);
      pvVar9 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                         ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)
                          (*local_1028 + 0x108),(ulong)local_102c);
      pvVar2 = *(void **)(pvVar9 + 0x28);
      std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)(*local_1028 + 0x108),
                 (ulong)local_102c);
      uVar12 = dynet::Dim::size((Dim *)CONCAT44(in_stack_ffffffffffffee34,uVar14));
      memcpy(pvVar1,pvVar2,(ulong)uVar12 << 2);
      local_102c = local_102c + 1;
    }
    local_ffc = local_ffc + 1;
    __gnu_cxx::
    __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
    ::operator++(&local_1018);
  }
  local_1038 = dynet::Model::lookup_parameters_list(local_148);
  local_1040._M_current =
       (LookupParameterStorage **)
       std::
       vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>::
       begin((vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
              *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
  local_1048 = (LookupParameterStorage **)
               std::
               vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
               ::end((vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                      *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
  while( true ) {
    bVar3 = __gnu_cxx::operator!=
                      ((__normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffee34,uVar14),
                       (__normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                        *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
    if (!bVar3) break;
    local_1050 = __gnu_cxx::
                 __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
                 ::operator*(&local_1040);
    local_1054 = 0;
    while( true ) {
      uVar7 = (ulong)local_1054;
      sVar5 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::size
                        ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)
                         (*local_1050 + 0x108));
      if (sVar5 <= uVar7) break;
      ppLVar8 = std::
                vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                ::operator[](local_1008,(ulong)local_ffc);
      pvVar9 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                         ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)
                          (*ppLVar8 + 0x108),(ulong)local_1054);
      pvVar1 = *(void **)(pvVar9 + 0x28);
      pvVar9 = std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                         ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)
                          (*local_1050 + 0x108),(ulong)local_1054);
      pvVar2 = *(void **)(pvVar9 + 0x28);
      std::vector<dynet::Tensor,_std::allocator<dynet::Tensor>_>::operator[]
                ((vector<dynet::Tensor,_std::allocator<dynet::Tensor>_> *)(*local_1050 + 0x108),
                 (ulong)local_1054);
      uVar12 = dynet::Dim::size((Dim *)CONCAT44(in_stack_ffffffffffffee34,uVar14));
      memcpy(pvVar1,pvVar2,(ulong)uVar12 << 2);
      local_1054 = local_1054 + 1;
    }
    local_ffc = local_ffc + 1;
    __gnu_cxx::
    __normal_iterator<dynet::LookupParameterStorage_*const_*,_std::vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>_>
    ::operator++(&local_1040);
  }
  uVar7 = (ulong)local_ffc;
  sVar5 = std::
          vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
          ::size(local_1008);
  if (uVar7 == sVar5) {
    local_1058 = 0;
    local_1060 = dynet::Model::parameters_list(local_38);
    local_1068 = dynet::Model::parameters_list(local_c0);
    local_1070._M_current =
         (ParameterStorage **)
         std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::begin
                   ((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *
                    )CONCAT44(in_stack_ffffffffffffee2c,uVar15));
    local_1078 = (ParameterStorage **)
                 std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ::end((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                        *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee34,uVar14),
                         (__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
      if (!bVar3) break;
      local_1080 = __gnu_cxx::
                   __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                   ::operator*(&local_1070);
      uVar7 = (ulong)local_1058;
      local_1058 = local_1058 + 1;
      ppPVar11 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ::operator[](local_1060,uVar7);
      pvVar1 = *(void **)(*ppPVar11 + 0x58);
      pvVar2 = *(void **)(*local_1080 + 0x58);
      uVar12 = dynet::Dim::size((Dim *)CONCAT44(in_stack_ffffffffffffee34,uVar14));
      memcpy(pvVar1,pvVar2,(ulong)uVar12 << 2);
      __gnu_cxx::
      __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
      ::operator++(&local_1070);
    }
    local_1088 = dynet::Model::parameters_list(local_148);
    local_1090._M_current =
         (ParameterStorage **)
         std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::begin
                   ((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *
                    )CONCAT44(in_stack_ffffffffffffee2c,uVar15));
    std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::end
              ((vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *)
               CONCAT44(in_stack_ffffffffffffee2c,uVar15));
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        ((__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee34,uVar14),
                         (__normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffee2c,uVar15));
      if (!bVar3) break;
      ppPVar10 = __gnu_cxx::
                 __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
                 ::operator*(&local_1090);
      uVar7 = (ulong)local_1058;
      local_1058 = local_1058 + 1;
      ppPVar11 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ::operator[](local_1060,uVar7);
      pvVar1 = *(void **)(*ppPVar11 + 0x58);
      pvVar2 = *(void **)(*ppPVar10 + 0x58);
      uVar12 = dynet::Dim::size((Dim *)CONCAT44(in_stack_ffffffffffffee34,uVar14));
      memcpy(pvVar1,pvVar2,(ulong)uVar12 << 2);
      __gnu_cxx::
      __normal_iterator<dynet::ParameterStorage_*const_*,_std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>_>
      ::operator++(&local_1090);
    }
    uVar7 = (ulong)local_1058;
    sVar5 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::size
                      (local_1060);
    if (uVar7 == sVar5) {
      dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel
                ((AttentionalModel<dynet::LSTMBuilder> *)CONCAT44(in_stack_ffffffffffffee54,uVar13))
      ;
      dynet::AttentionalModel<dynet::LSTMBuilder>::~AttentionalModel
                ((AttentionalModel<dynet::LSTMBuilder> *)CONCAT44(in_stack_ffffffffffffee54,uVar13))
      ;
      dynet::Model::~Model(local_148);
      dynet::Model::~Model(local_c0);
      return;
    }
    __assert_fail("did == dparams.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                  ,0x7e,
                  "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
                 );
  }
  __assert_fail("lid == lparams.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/trevorcohn[P]mantis/src/biattentional.cc"
                ,0x76,
                "void BidirAttentionalModel<dynet::LSTMBuilder>::initialise(const std::string &, const std::string &, Model &) [Builder = dynet::LSTMBuilder]"
               );
}

Assistant:

void initialise(const std::string &src_file, const std::string &tgt_file, Model &model)
    {
	Model sm, tm;
	AttentionalModel<Builder> smb(&sm, VOCAB_SIZE_SRC, VOCAB_SIZE_TGT, 
		LAYERS, HIDDEN_DIM, ALIGN_DIM, BIDIR, GIZA_P, GIZA_M, GIZA_F, DOC, FERT);
	AttentionalModel<Builder> tmb(&tm, VOCAB_SIZE_TGT, VOCAB_SIZE_SRC,
		LAYERS, HIDDEN_DIM, ALIGN_DIM, BIDIR, GIZA_P, GIZA_M, GIZA_F, DOC, FERT);

	//for (const auto &p : sm.lookup_parameters_list())  
            //std::cerr << "\tlookup size: " << p->values[0].d << " number: " << p->values.size() << std::endl;
	//for (const auto &p : sm.parameters_list())  
            //std::cerr << "\tparam size: " << p->values.d << std::endl;

        std::cerr << "... loading " << src_file << " ..." << std::endl;
	{
	    ifstream in(src_file);
	    boost::archive::text_iarchive ia(in);
	    ia >> sm;
	}

        std::cerr << "... loading " << tgt_file << " ..." << std::endl;
	{
	    ifstream in(tgt_file);
	    boost::archive::text_iarchive ia(in);
	    ia >> tm;
	}
        std::cerr << "... merging parameters ..." << std::endl;

	unsigned lid = 0;
	auto &lparams = model.lookup_parameters_list();
	assert(lparams.size() == 2*sm.lookup_parameters_list().size());
	for (const auto &p : sm.lookup_parameters_list())  {
	    for (unsigned i = 0; i < p->values.size(); ++i) 
		memcpy(lparams[lid]->values[i].v, &p->values[i].v[0], sizeof(dynet::real) * p->values[i].d.size());
	    lid++;
	}
	for (const auto &p : tm.lookup_parameters_list()) {
	    for (unsigned i = 0; i < p->values.size(); ++i) 
		memcpy(lparams[lid]->values[i].v, &p->values[i].v[0], sizeof(dynet::real) * p->values[i].d.size());
	    lid++;
	}
	assert(lid == lparams.size());

	unsigned did = 0;
	auto &dparams = model.parameters_list();
	for (const auto &p : sm.parameters_list()) 
	    memcpy(dparams[did++]->values.v, &p->values.v[0], sizeof(dynet::real) * p->values.d.size());
	for (const auto &p : tm.parameters_list()) 
	    memcpy(dparams[did++]->values.v, &p->values.v[0], sizeof(dynet::real) * p->values.d.size());
	assert(did == dparams.size());
    }